

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::insert
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this,
          vector3_base<int> *item,range r)

{
  vector3_base<int> *pvVar1;
  anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 aVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int new_len;
  
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar5 = (int)((long)r.begin - (long)this->list >> 2) * -0x55555555;
    incsize(this);
    iVar3 = this->num_elements;
    lVar6 = (long)iVar3;
    new_len = iVar3 + 1;
    if (this->list_size <= iVar3) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar5 < iVar3) {
      lVar4 = lVar6 * 0xc;
      do {
        pvVar1 = this->list;
        *(anon_union_4_4_d826a04f_for_vector3_base<int>_5 *)((long)&pvVar1->field_2 + lVar4) =
             pvVar1[(long)new_len + -2].field_2;
        *(undefined8 *)((long)&pvVar1->field_0 + lVar4) =
             *(undefined8 *)(pvVar1 + (long)new_len + -2);
        lVar6 = lVar6 + -1;
        new_len = new_len + -1;
        lVar4 = lVar4 + -0xc;
      } while (iVar5 < lVar6);
    }
    pvVar1 = this->list;
    pvVar1[iVar5].field_2 = item->field_2;
    aVar2 = item->field_1;
    pvVar1 = pvVar1 + iVar5;
    pvVar1->field_0 = item->field_0;
    pvVar1->field_1 = aVar2;
    return this->num_elements + -1;
  }
  iVar3 = add(this,item);
  return iVar3;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}